

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

const_iterator * __thiscall
plot::
Alignment<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
::cend(const_iterator *__return_storage_ptr__,
      Alignment<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
      *this)

{
  size_t right_margin;
  size_t local_1170;
  size_t local_1168;
  long local_1160;
  long local_1158;
  iterator local_1138;
  iterator local_d08;
  alignment_line<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
  local_8d8;
  size_t local_58;
  long left;
  long top;
  long vmargin;
  long hmargin;
  Size block_sz;
  Size sz;
  Alignment<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
  *this_local;
  
  join_0x00000010_0x00000000_ = size(this);
  _hmargin = detail::
             normal_block_ref_traits<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_true>
             ::size(&this->block_);
  vmargin = block_sz.y - hmargin;
  top = sz.x - block_sz.x;
  if (this->valign_ == Middle) {
    local_1158 = top / 2;
  }
  else {
    local_1160 = top;
    if (this->valign_ != Bottom) {
      local_1160 = 0;
    }
    local_1158 = local_1160;
  }
  left = local_1158;
  if (this->halign_ == Center) {
    local_1168 = vmargin / 2;
  }
  else {
    local_1170 = vmargin;
    if (this->halign_ != Right) {
      local_1170 = 0;
    }
    local_1168 = local_1170;
  }
  local_58 = local_1168;
  right_margin = vmargin - local_1168;
  local_1158 = top - local_1158;
  detail::
  normal_block_ref_traits<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_true>
  ::end(&local_d08,&this->block_);
  detail::
  normal_block_ref_traits<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_true>
  ::end(&local_1138,&this->block_);
  detail::
  alignment_line<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
  ::alignment_line(&local_8d8,this,local_1168,right_margin,local_1158,&local_d08,&local_1138);
  detail::
  block_iterator<plot::Alignment<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>,_plot::detail::alignment_line<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>_>
  ::block_iterator(__return_storage_ptr__,&local_8d8);
  return __return_storage_ptr__;
}

Assistant:

const_iterator cend() const {
        auto sz = size();
        auto block_sz = detail::block_traits<Block>::size(block_);

        auto hmargin = sz.x - block_sz.x,
             vmargin = sz.y - block_sz.y;
        auto top = (valign_ == VAlign::Middle) ? vmargin / 2
                                               : (valign_ == VAlign::Bottom) ? vmargin : 0;
        auto left = (halign_ == Align::Center) ? hmargin / 2
                                              : (halign_ == Align::Right) ? hmargin : 0;

        return { { this, std::size_t(left), std::size_t(hmargin - left), std::ptrdiff_t(vmargin - top),
                   detail::block_traits<Block>::end(block_), detail::block_traits<Block>::end(block_) } };
    }